

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rans_symbol_encoder.h
# Opt level: O2

bool __thiscall
draco::RAnsSymbolEncoder<13>::Create
          (RAnsSymbolEncoder<13> *this,uint64_t *frequencies,int num_symbols,EncoderBuffer *buffer)

{
  int iVar1;
  pointer prVar2;
  uint64_t uVar3;
  uint32_t uVar4;
  bool bVar5;
  int i;
  uint32_t uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  int i_2;
  long lVar12;
  long lVar13;
  uint32_t uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  pointer piVar18;
  double dVar19;
  double dVar20;
  undefined8 uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  allocator_type local_99;
  long local_98;
  uint64_t *local_90;
  RAnsSymbolEncoder<13> *local_88;
  ulong local_80;
  pointer local_78;
  undefined8 uStack_70;
  vector<int,_std::allocator<int>_> sorted_probabilities;
  
  uVar9 = 0;
  uVar11 = (ulong)(uint)num_symbols;
  if (num_symbols < 1) {
    uVar11 = uVar9;
  }
  local_80 = 0;
  lVar12 = 0;
  for (; uVar11 != uVar9; uVar9 = uVar9 + 1) {
    lVar12 = lVar12 + frequencies[uVar9];
    if (frequencies[uVar9] != 0) {
      local_80 = uVar9 & 0xffffffff;
    }
  }
  uVar6 = (int)local_80 + 1;
  this->num_symbols_ = uVar6;
  std::vector<draco::rans_sym,_std::allocator<draco::rans_sym>_>::resize
            (&this->probability_table_,(long)(int)uVar6);
  auVar22._8_4_ = (int)((ulong)lVar12 >> 0x20);
  auVar22._0_8_ = lVar12;
  auVar22._12_4_ = 0x45300000;
  prVar2 = (this->probability_table_).
           super__Vector_base<draco::rans_sym,_std::allocator<draco::rans_sym>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar13 = (long)(int)local_80;
  iVar16 = 0;
  for (lVar10 = 0; lVar10 <= lVar13; lVar10 = lVar10 + 1) {
    uVar3 = frequencies[lVar10];
    auVar24._8_4_ = (int)(uVar3 >> 0x20);
    auVar24._0_8_ = uVar3;
    auVar24._12_4_ = 0x45300000;
    uVar14 = (uint32_t)
             (long)((((auVar24._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) /
                    ((auVar22._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)lVar12) - 4503599627370496.0))) * 524288.0 +
                   0.5);
    uVar4 = uVar14;
    if (uVar3 != 0) {
      uVar4 = 1;
    }
    if (uVar14 != 0) {
      uVar4 = uVar14;
    }
    prVar2[lVar10].prob = uVar4;
    iVar16 = iVar16 + uVar4;
  }
  if (iVar16 != 0x80000) {
    std::vector<int,_std::allocator<int>_>::vector(&sorted_probabilities,(long)(int)uVar6,&local_99)
    ;
    for (lVar12 = 0; lVar12 <= lVar13; lVar12 = lVar12 + 1) {
      sorted_probabilities.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[lVar12] = (int)lVar12;
    }
    std::
    __stable_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<draco::RAnsSymbolEncoder<13>::ProbabilityLess>>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               sorted_probabilities.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               sorted_probabilities.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,
               (_Iter_comp_iter<draco::RAnsSymbolEncoder<13>::ProbabilityLess>)this);
    if (0x7ffff < iVar16) {
      iVar17 = iVar16 + -0x80000;
      uVar11 = local_80;
      local_98 = lVar13;
      local_90 = frequencies;
      local_88 = this;
      do {
        lVar13 = local_98;
        frequencies = local_90;
        this = local_88;
        if (iVar17 < 1) goto LAB_0017e433;
        dVar19 = (double)iVar16;
        local_78 = sorted_probabilities.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
        prVar2 = (local_88->probability_table_).
                 super__Vector_base<draco::rans_sym,_std::allocator<draco::rans_sym>_>._M_impl.
                 super__Vector_impl_data._M_start;
        for (iVar15 = 0; uVar7 = (int)uVar11 + iVar15, 0 < (int)uVar7; iVar15 = iVar15 + -1) {
          iVar1 = local_78[uVar7];
          uVar7 = prVar2[iVar1].prob;
          if (uVar7 < 2) {
            if (iVar15 == 0) {
              std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                        (&sorted_probabilities.super__Vector_base<int,_std::allocator<int>_>);
              goto LAB_0017e62d;
            }
            break;
          }
          dVar20 = floor((double)uVar7 * (524288.0 / dVar19));
          iVar8 = 1;
          if (uVar7 - (int)dVar20 != 0) {
            iVar8 = uVar7 - (int)dVar20;
          }
          if ((int)uVar7 <= iVar8) {
            iVar8 = uVar7 - 1;
          }
          if (iVar17 <= iVar8) {
            iVar8 = iVar17;
          }
          prVar2[iVar1].prob = uVar7 - iVar8;
          iVar16 = iVar16 - iVar8;
          iVar17 = iVar17 - iVar8;
          uVar11 = local_80;
          if (iVar16 == 0x80000) {
            iVar16 = 0x80000;
            break;
          }
        }
      } while( true );
    }
    prVar2 = (this->probability_table_).
             super__Vector_base<draco::rans_sym,_std::allocator<draco::rans_sym>_>._M_impl.
             super__Vector_impl_data._M_start;
    prVar2[sorted_probabilities.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish[-1]].prob =
         (prVar2[sorted_probabilities.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish[-1]].prob - iVar16) + 0x80000;
LAB_0017e433:
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&sorted_probabilities.super__Vector_base<int,_std::allocator<int>_>);
  }
  prVar2 = (this->probability_table_).
           super__Vector_base<draco::rans_sym,_std::allocator<draco::rans_sym>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = 0;
  for (lVar12 = 0; lVar12 <= lVar13; lVar12 = lVar12 + 1) {
    prVar2[lVar12].cum_prob = uVar6;
    uVar6 = uVar6 + prVar2[lVar12].prob;
  }
  if (uVar6 == 0x80000) {
    piVar18 = (pointer)0x0;
    uVar21 = 0;
    for (lVar12 = 0; lVar12 <= lVar13; lVar12 = lVar12 + 1) {
      uVar7 = (this->probability_table_).
              super__Vector_base<draco::rans_sym,_std::allocator<draco::rans_sym>_>._M_impl.
              super__Vector_impl_data._M_start[lVar12].prob;
      if (uVar7 != 0) {
        uVar3 = frequencies[lVar12];
        auVar23._8_4_ = (int)(uVar3 >> 0x20);
        auVar23._0_8_ = uVar3;
        auVar23._12_4_ = 0x45300000;
        local_78 = piVar18;
        uStack_70 = uVar21;
        dVar19 = log2((double)uVar7 * 1.9073486328125e-06);
        piVar18 = (pointer)((double)local_78 +
                           dVar19 * ((auVar23._8_8_ - 1.9342813113834067e+25) +
                                    ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)))
        ;
        uVar21 = uStack_70;
        local_78 = piVar18;
      }
    }
    dVar19 = ceil(-(double)piVar18);
    this->num_expected_bits_ =
         (long)(dVar19 - 9.223372036854776e+18) & (long)dVar19 >> 0x3f | (long)dVar19;
    bVar5 = EncodeTable(this,buffer);
  }
  else {
LAB_0017e62d:
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool RAnsSymbolEncoder<unique_symbols_bit_length_t>::Create(
    const uint64_t *frequencies, int num_symbols, EncoderBuffer *buffer) {
  // Compute the total of the input frequencies.
  uint64_t total_freq = 0;
  int max_valid_symbol = 0;
  for (int i = 0; i < num_symbols; ++i) {
    total_freq += frequencies[i];
    if (frequencies[i] > 0) {
      max_valid_symbol = i;
    }
  }
  num_symbols = max_valid_symbol + 1;
  num_symbols_ = num_symbols;
  probability_table_.resize(num_symbols);
  const double total_freq_d = static_cast<double>(total_freq);
  const double rans_precision_d = static_cast<double>(rans_precision_);
  // Compute probabilities by rescaling the normalized frequencies into interval
  // [1, rans_precision - 1]. The total probability needs to be equal to
  // rans_precision.
  int total_rans_prob = 0;
  for (int i = 0; i < num_symbols; ++i) {
    const uint64_t freq = frequencies[i];

    // Normalized probability.
    const double prob = static_cast<double>(freq) / total_freq_d;

    // RAns probability in range of [1, rans_precision - 1].
    uint32_t rans_prob = static_cast<uint32_t>(prob * rans_precision_d + 0.5f);
    if (rans_prob == 0 && freq > 0) {
      rans_prob = 1;
    }
    probability_table_[i].prob = rans_prob;
    total_rans_prob += rans_prob;
  }
  // Because of rounding errors, the total precision may not be exactly accurate
  // and we may need to adjust the entries a little bit.
  if (total_rans_prob != rans_precision_) {
    std::vector<int> sorted_probabilities(num_symbols);
    for (int i = 0; i < num_symbols; ++i) {
      sorted_probabilities[i] = i;
    }
    std::stable_sort(sorted_probabilities.begin(), sorted_probabilities.end(),
                     ProbabilityLess(&probability_table_));
    if (total_rans_prob < rans_precision_) {
      // This happens rather infrequently, just add the extra needed precision
      // to the most frequent symbol.
      probability_table_[sorted_probabilities.back()].prob +=
          rans_precision_ - total_rans_prob;
    } else {
      // We have over-allocated the precision, which is quite common.
      // Rescale the probabilities of all symbols.
      int32_t error = total_rans_prob - rans_precision_;
      while (error > 0) {
        const double act_total_prob_d = static_cast<double>(total_rans_prob);
        const double act_rel_error_d = rans_precision_d / act_total_prob_d;
        for (int j = num_symbols - 1; j > 0; --j) {
          int symbol_id = sorted_probabilities[j];
          if (probability_table_[symbol_id].prob <= 1) {
            if (j == num_symbols - 1) {
              return false;  // Most frequent symbol would be empty.
            }
            break;
          }
          const int32_t new_prob = static_cast<int32_t>(
              floor(act_rel_error_d *
                    static_cast<double>(probability_table_[symbol_id].prob)));
          int32_t fix = probability_table_[symbol_id].prob - new_prob;
          if (fix == 0u) {
            fix = 1;
          }
          if (fix >= static_cast<int32_t>(probability_table_[symbol_id].prob)) {
            fix = probability_table_[symbol_id].prob - 1;
          }
          if (fix > error) {
            fix = error;
          }
          probability_table_[symbol_id].prob -= fix;
          total_rans_prob -= fix;
          error -= fix;
          if (total_rans_prob == rans_precision_) {
            break;
          }
        }
      }
    }
  }

  // Compute the cumulative probability (cdf).
  uint32_t total_prob = 0;
  for (int i = 0; i < num_symbols; ++i) {
    probability_table_[i].cum_prob = total_prob;
    total_prob += probability_table_[i].prob;
  }
  if (total_prob != rans_precision_) {
    return false;
  }

  // Estimate the number of bits needed to encode the input.
  // From Shannon entropy the total number of bits N is:
  //   N = -sum{i : all_symbols}(F(i) * log2(P(i)))
  // where P(i) is the normalized probability of symbol i and F(i) is the
  // symbol's frequency in the input data.
  double num_bits = 0;
  for (int i = 0; i < num_symbols; ++i) {
    if (probability_table_[i].prob == 0) {
      continue;
    }
    const double norm_prob =
        static_cast<double>(probability_table_[i].prob) / rans_precision_d;
    num_bits += static_cast<double>(frequencies[i]) * log2(norm_prob);
  }
  num_expected_bits_ = static_cast<uint64_t>(ceil(-num_bits));
  if (!EncodeTable(buffer)) {
    return false;
  }
  return true;
}